

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O0

Vec_Ptr_t * Mpm_ManFindCells(Mio_Library_t *pMio,SC_Lib *pScl,Vec_Wec_t *vNpnConfigs)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  SC_Cell *pSVar2;
  Mio_Gate_t *Entry;
  int local_50;
  int iClass;
  int Config;
  SC_Cell *pCell;
  Mio_Gate_t *pMioGate;
  Vec_Int_t *vClass;
  Vec_Ptr_t *vNpnGatesMio;
  Vec_Wec_t *vNpnConfigs_local;
  SC_Lib *pScl_local;
  Mio_Library_t *pMio_local;
  
  iVar1 = Vec_WecSize(vNpnConfigs);
  p = Vec_PtrStart(iVar1);
  local_50 = 0;
  do {
    iVar1 = Vec_WecSize(vNpnConfigs);
    if (iVar1 <= local_50) {
      return p;
    }
    p_00 = Vec_WecEntry(vNpnConfigs,local_50);
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(p_00,0);
      pSVar2 = SC_LibCell(pScl,iVar1 >> 0x11);
      Entry = Mio_LibraryReadGateByName(pMio,pSVar2->pName,(char *)0x0);
      if (Entry == (Mio_Gate_t *)0x0) {
        Vec_PtrFree(p);
        return (Vec_Ptr_t *)0x0;
      }
      if (Entry == (Mio_Gate_t *)0x0) {
        __assert_fail("pMioGate != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                      ,0x7c,"Vec_Ptr_t *Mpm_ManFindCells(Mio_Library_t *, SC_Lib *, Vec_Wec_t *)");
      }
      Vec_PtrWriteEntry(p,local_50,Entry);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Mpm_ManFindCells( Mio_Library_t * pMio, SC_Lib * pScl, Vec_Wec_t * vNpnConfigs )
{
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vClass;
    Mio_Gate_t * pMioGate;
    SC_Cell * pCell;
    int Config, iClass;
    vNpnGatesMio = Vec_PtrStart( Vec_WecSize(vNpnConfigs) );
    Vec_WecForEachLevel( vNpnConfigs, vClass, iClass )
    {
        if ( Vec_IntSize(vClass) == 0 )
            continue;
        Config = Vec_IntEntry(vClass, 0);
        pCell = SC_LibCell( pScl, (Config >> 17) );
        pMioGate = Mio_LibraryReadGateByName( pMio, pCell->pName, NULL );
        if ( pMioGate == NULL )
        {
            Vec_PtrFree( vNpnGatesMio );
            return NULL;
        }
        assert( pMioGate != NULL );
        Vec_PtrWriteEntry( vNpnGatesMio, iClass, pMioGate );
    }
    return vNpnGatesMio;
}